

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O0

void free_instruction_operand_pseudos(Proc *proc,Instruction *insn)

{
  undefined1 local_40 [8];
  PtrListIterator operanditer__;
  Pseudo *last;
  Pseudo *operand;
  Instruction *insn_local;
  Proc *proc_local;
  
  operanditer__.__nr = 0;
  operanditer__._20_4_ = 0;
  raviX_ptrlist_reverse_iterator((PtrListIterator *)local_40,(PtrList *)insn->operands);
  last = (Pseudo *)raviX_ptrlist_iter_prev((PtrListIterator *)local_40);
  while (last != (Pseudo *)0x0) {
    free_temp_pseudo(proc,last,false);
    operanditer__._16_8_ = last;
    last = (Pseudo *)raviX_ptrlist_iter_prev((PtrListIterator *)local_40);
  }
  if ((operanditer__._16_8_ != 0) && ((*(uint *)operanditer__._16_8_ & 0xf) == 0xc)) {
    free_temp_pseudo(proc,*(Pseudo **)(operanditer__._16_8_ + 8),false);
  }
  return;
}

Assistant:

static void free_instruction_operand_pseudos(Proc *proc, Instruction *insn)
{
	Pseudo *operand;
	Pseudo *last = NULL;
	FOR_EACH_PTR_REVERSE(insn->operands, Pseudo, operand) {
		free_temp_pseudo(proc, operand, false);
		last = operand;
	} END_FOR_EACH_PTR_REVERSE(operand)
	if (last != NULL && last->type == PSEUDO_RANGE_SELECT) {
		// free the underlying range pseudo used by range select
		free_temp_pseudo(proc, last->range_pseudo, false);
	}
}